

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_parallel_game_of_life.cpp
# Opt level: O3

int __thiscall App::enterApp(App *this)

{
  bool bVar1;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [32];
  
  (this->wnd).window.eventDriven = false;
  local_38._0_8_ = this;
  std::function<void(Mouse_const&)>::operator=
            ((function<void(Mouse_const&)> *)(MainWindowDetails::relay + 0x78),
             (anon_class_8_1_8991fb9c *)local_38);
  local_38._0_8_ = this;
  std::function<void(int,int,StateChange)>::operator=
            ((function<void(int,int,StateChange)> *)&(this->wnd).onAppResize,
             (anon_class_8_1_8991fb9c *)local_38);
  local_38._0_8_ = this;
  std::function<void()>::operator=
            ((function<void()> *)&(this->wnd).onAppStep,(anon_class_8_1_8991fb9c *)local_38);
  std::function<void()>::operator=
            ((function<void()> *)&(this->wnd).onAppExit,(anon_class_1_0_00000001 *)local_38);
  local_38._0_8_ = this;
  std::function<void(SoftwareRenderer&)>::operator=
            ((function<void(SoftwareRenderer&)> *)&(this->wnd).onAppRender,
             (anon_class_8_1_8991fb9c *)local_38);
  local_38._0_8_ = (App *)(local_38 + 0x10);
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_38,L"C++ App",L"");
  bVar1 = MainWindow::open<App::enterApp()::_lambda()_3_>
                    (&this->wnd,(wstring *)local_38,(Pos2D)0x400000002a,(Size2D)0x1e000000280,true,
                     &local_39);
  if ((App *)local_38._0_8_ != (App *)(local_38 + 0x10)) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ * 4 + 4);
  }
  return bVar1 - 1;
}

Assistant:

int enterApp()
	{
		wnd.window.eventDriven = false;

		wnd.mouseHandler([&](Mouse const& m)
		{ 
			x = m.x; y = m.y;
			
			if     (m.event == Mouse::Move      ){            /*std::cout << "Mouse moved: " << x << " " << y << "\n";*/ }
			else if(m.event == Mouse::Scroll    ){ z += m.dz; std::cout << "Mouse scrolled: " << z << "\n";  }
			else if(m.event == Mouse::LeftDown  ){            std::cout << "Mouse Left Down\n"  ; }
			else if(m.event == Mouse::LeftUp    ){            std::cout << "Mouse Left Up\n"    ; }
			else if(m.event == Mouse::MiddleDown){            std::cout << "Mouse Middle Down\n"; }
			else if(m.event == Mouse::MiddleUp  ){            std::cout << "Mouse Middle Up\n"  ; }
			else if(m.event == Mouse::RightDown ){            std::cout << "Mouse Right Down\n" ; }
			else if(m.event == Mouse::RightUp   ){            std::cout << "Mouse Right Up\n"   ; }
		});
		wnd.resizeHandler([&](int w, int h, StateChange /*sc*/)
		{
			ResizeTables(w-32, h-32);
			printf("Resize: %i %i\n", w, h);
		} );
		wnd.idleHandler([&]
		{
            auto t0 = std::chrono::high_resolution_clock::now();
			table[1 - idx].parallel_fill2([&t = table[idx]](int x, int y)->char
			{
				auto w = t.w;
				auto h = t.h;
				if(w < 1 || h < 1){ return 0; }
				auto c = t(x, y);
				auto xp1 = x == w-1 ? 0   : x+1;
				auto xm1 = x == 0   ? w-1 : x-1;
				auto yp1 = y == h-1 ? 0   : y+1;
				auto ym1 = y == 0   ? h-1 : y-1;
				auto sum = t(xm1, ym1) + t(x, ym1) + t(xp1, ym1)
					     + t(xm1, y  ) +             t(xp1, y  )
					     + t(xm1, yp1) + t(x, yp1) + t(xp1, yp1);
				if(c == 0 &&  sum == 3           ){ return 1; }
				if(c == 1 && (sum < 2 || sum > 3)){ return 0; }
				return c;
			});
			idx = 1 - idx;
            auto t1 = std::chrono::high_resolution_clock::now();
            auto dt = (static_cast<std::chrono::duration<double, std::milli>>(t1-t0)).count();
            frame_time += dt;
            frame_count += 1;
		});
		wnd.exitHandler([&]{ });

		wnd.renderHandler( [&](SoftwareRenderer& r)
		{
			r.forall_pixels([](auto, auto, auto){ return color(255, 255, 255); });
			r.plot_by_index(16, 16, table[idx].w, table[idx].h, [&](auto x, auto y){ return table[idx](x, y) == 0 ? dead : live; });
            if(frame_count == 200)
            {
                std::cout << "Average step time: " << frame_time / frame_count << std::endl;
                frame_time = 0.0;
                frame_count = 0;
            }
		});

		bool res = wnd.open(L"C++ App", {42, 64}, {640, 480}, true, [&]{ return true; });
		return res ? 0 : -1;
	}